

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnionDatatypeValidator.cpp
# Opt level: O3

int __thiscall
xercesc_4_0::UnionDatatypeValidator::init(UnionDatatypeValidator *this,EVP_PKEY_CTX *ctx)

{
  int *piVar1;
  short *psVar2;
  XMLCh XVar3;
  XMLCh XVar4;
  XMLSize_t XVar5;
  RefArrayVectorOf<char16_t> *pRVar6;
  XMLCh *__src;
  RefHashTableBucketElem<xercesc_4_0::KVStringPair> *pRVar7;
  int iVar8;
  uint uVar9;
  KVStringPair *toCopy;
  XMLCh *pXVar10;
  undefined4 extraout_var;
  RegularExpression *pRVar11;
  char16_t *pcVar12;
  EVP_PKEY_CTX *pEVar13;
  InvalidDatatypeFacetException *this_00;
  RefArrayVectorOf<char16_t> *in_RCX;
  XMLCh *pXVar14;
  RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher> *in_RDX;
  MemoryManager *in_R8;
  size_t __n;
  MemoryManager *manager;
  XMLSize_t XVar15;
  KVStringPair pair;
  RefHashTableOfEnumerator<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher> local_90;
  KVStringPair local_60;
  
  if (in_RCX != (RefArrayVectorOf<char16_t> *)0x0) {
    if ((this->fEnumerationInherited == false) &&
       (this->fEnumeration != (RefArrayVectorOf<char16_t> *)0x0)) {
      (*(this->fEnumeration->super_BaseRefVectorOf<char16_t>)._vptr_BaseRefVectorOf[1])();
    }
    this->fEnumeration = in_RCX;
    this->fEnumerationInherited = false;
    piVar1 = &(this->super_DatatypeValidator).fFacetsDefined;
    *(byte *)piVar1 = (byte)*piVar1 | 0x10;
  }
  if (in_RDX != (RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher> *)0x0) {
    local_90.super_XMLEnumerator<xercesc_4_0::KVStringPair>._vptr_XMLEnumerator =
         (_func_int **)&PTR__RefHashTableOfEnumerator_00406778;
    local_90.fAdopted = false;
    local_90.fCurElem = (RefHashTableBucketElem<xercesc_4_0::KVStringPair> *)0x0;
    local_90.fCurHash = 0;
    pRVar7 = local_90.fCurElem;
    if (in_RDX->fHashModulus != 0) {
      XVar5 = 1;
      do {
        XVar15 = XVar5;
        pRVar7 = in_RDX->fBucketList[XVar15 - 1];
        if (in_RDX->fBucketList[XVar15 - 1] !=
            (RefHashTableBucketElem<xercesc_4_0::KVStringPair> *)0x0) break;
        XVar5 = XVar15 + 1;
        pRVar7 = local_90.fCurElem;
        local_90.fCurHash = XVar15;
      } while (XVar15 != in_RDX->fHashModulus);
    }
    local_90.fCurElem = pRVar7;
    local_90.fToEnum = in_RDX;
    while ((local_90.fCurElem != (RefHashTableBucketElem<xercesc_4_0::KVStringPair> *)0x0 ||
           (local_90.fCurHash != (local_90.fToEnum)->fHashModulus))) {
      toCopy = RefHashTableOfEnumerator<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>::
               nextElement(&local_90);
      KVStringPair::KVStringPair(&local_60,toCopy);
      __src = local_60.fValue;
      if (local_60.fKey != L"pattern") {
        pXVar10 = L"pattern";
        if (local_60.fKey != (XMLCh *)0x0) {
          pXVar10 = L"pattern";
          pXVar14 = local_60.fKey;
          while (XVar3 = *pXVar14, XVar3 != L'\0') {
            pXVar14 = pXVar14 + 1;
            XVar4 = *pXVar10;
            pXVar10 = pXVar10 + 1;
            if (XVar3 != XVar4) goto LAB_002fc747;
          }
        }
        if (*pXVar10 != L'\0') {
LAB_002fc747:
          this_00 = (InvalidDatatypeFacetException *)__cxa_allocate_exception(0x30);
          InvalidDatatypeFacetException::InvalidDatatypeFacetException
                    (this_00,
                     "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/datatype/UnionDatatypeValidator.cpp"
                     ,0xa2,FACET_Invalid_Tag,local_60.fKey,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0,
                     in_R8);
          __cxa_throw(this_00,&InvalidDatatypeFacetException::typeinfo,XMLException::~XMLException);
        }
      }
      if ((this->super_DatatypeValidator).fPattern != (XMLCh *)0x0) {
        (*((this->super_DatatypeValidator).fMemoryManager)->_vptr_MemoryManager[4])();
        pRVar11 = (this->super_DatatypeValidator).fRegex;
        if (pRVar11 != (RegularExpression *)0x0) {
          (*pRVar11->_vptr_RegularExpression[1])();
        }
      }
      manager = (this->super_DatatypeValidator).fMemoryManager;
      if (__src == (XMLCh *)0x0) {
        pXVar10 = (XMLCh *)0x0;
      }
      else {
        __n = 0;
        do {
          psVar2 = (short *)((long)__src + __n);
          __n = __n + 2;
        } while (*psVar2 != 0);
        iVar8 = (*manager->_vptr_MemoryManager[3])(manager,__n);
        pXVar10 = (XMLCh *)CONCAT44(extraout_var,iVar8);
        memcpy(pXVar10,__src,__n);
        manager = (this->super_DatatypeValidator).fMemoryManager;
      }
      (this->super_DatatypeValidator).fPattern = pXVar10;
      pRVar11 = (RegularExpression *)XMemory::operator_new(0x70,manager);
      RegularExpression::RegularExpression
                (pRVar11,(this->super_DatatypeValidator).fPattern,L"X",
                 (this->super_DatatypeValidator).fMemoryManager);
      (this->super_DatatypeValidator).fRegex = pRVar11;
      if ((this->super_DatatypeValidator).fPattern != (XMLCh *)0x0) {
        piVar1 = &(this->super_DatatypeValidator).fFacetsDefined;
        *(byte *)piVar1 = (byte)*piVar1 | 8;
      }
      KVStringPair::~KVStringPair(&local_60);
    }
    if (((((this->super_DatatypeValidator).fFacetsDefined & 0x10) != 0) &&
        (this->fEnumeration != (RefArrayVectorOf<char16_t> *)0x0)) &&
       (XVar5 = (this->fEnumeration->super_BaseRefVectorOf<char16_t>).fCurCount, XVar5 != 0)) {
      XVar15 = 0;
      do {
        pcVar12 = BaseRefVectorOf<char16_t>::elementAt
                            (&this->fEnumeration->super_BaseRefVectorOf<char16_t>,XVar15);
        (**(code **)(*(long *)ctx + 0x40))(ctx,pcVar12,0,in_R8);
        XVar15 = XVar15 + 1;
      } while (XVar5 != XVar15);
    }
    RefHashTableOfEnumerator<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>::
    ~RefHashTableOfEnumerator(&local_90);
  }
  pEVar13 = ctx;
  if (((byte)ctx[0x14] & 0x10) != 0) {
    uVar9 = (this->super_DatatypeValidator).fFacetsDefined;
    pEVar13 = (EVP_PKEY_CTX *)(ulong)uVar9;
    if (((uVar9 & 0x10) == 0) &&
       (pRVar6 = *(RefArrayVectorOf<char16_t> **)(ctx + 0x70),
       pRVar6 != (RefArrayVectorOf<char16_t> *)0x0)) {
      if ((this->fEnumerationInherited == false) &&
         (this->fEnumeration != (RefArrayVectorOf<char16_t> *)0x0)) {
        (*(this->fEnumeration->super_BaseRefVectorOf<char16_t>)._vptr_BaseRefVectorOf[1])();
        uVar9 = (this->super_DatatypeValidator).fFacetsDefined;
      }
      this->fEnumeration = pRVar6;
      this->fEnumerationInherited = true;
      pEVar13 = (EVP_PKEY_CTX *)(ulong)(uVar9 | 0x10);
      (this->super_DatatypeValidator).fFacetsDefined = uVar9 | 0x10;
    }
  }
  return (int)pEVar13;
}

Assistant:

void UnionDatatypeValidator::init(DatatypeValidator*            const baseValidator
                                , RefHashTableOf<KVStringPair>* const facets
                                , RefArrayVectorOf<XMLCh>*      const enums
                                , MemoryManager*                const manager)
{
    if (enums)
        setEnumeration(enums, false);

    // Set Facets if any defined
    if (facets)
    {
        XMLCh* key;
        XMLCh* value;
        RefHashTableOfEnumerator<KVStringPair> e(facets, false, manager);

        while (e.hasMoreElements())
        {
            KVStringPair pair = e.nextElement();
            key = pair.getKey();
            value = pair.getValue();

            if (XMLString::equals(key, SchemaSymbols::fgELT_PATTERN))
            {
                setPattern(value);
                if (getPattern())
                    setFacetsDefined(DatatypeValidator::FACET_PATTERN);
                // do not construct regex until needed
            }
            else
            {
                 ThrowXMLwithMemMgr1(InvalidDatatypeFacetException
                         , XMLExcepts::FACET_Invalid_Tag
                         , key
                         , manager);
            }
        }//while

        /***
           Schema constraint: Part I -- self checking
        ***/
        // Nil

        /***
           Schema constraint: Part II base vs derived checking
        ***/
        // check 4.3.5.c0 must: enumeration values from the value space of base
        if ( ((getFacetsDefined() & DatatypeValidator::FACET_ENUMERATION) != 0) &&
            (getEnumeration() !=0))
        {
            XMLSize_t i = 0;
            XMLSize_t enumLength = getEnumeration()->size();
            try
            {
                for ( ; i < enumLength; i++)
                {
                    // ask parent do a complete check
                    //
                    // enum need NOT be passed this->checkContent()
                    // since there are no other facets for Union, parent
                    // checking is good enough.
                    //
                    baseValidator->validate(getEnumeration()->elementAt(i), (ValidationContext*)0, manager);

                }
            }

            catch ( XMLException& )
            {
                ThrowXMLwithMemMgr1(InvalidDatatypeFacetException
                            , XMLExcepts::FACET_enum_base
                            , getEnumeration()->elementAt(i)
                            , manager);
            }
        }

    }// End of Facet setting

    /***
        Inherit facets from base.facets

        The reason of this inheriting (or copying values) is to ease
        schema constraint checking, so that we need NOT trace back to our
        very first base validator in the hierachy. Instead, we are pretty
        sure checking against immediate base validator is enough.
    ***/

    UnionDatatypeValidator *pBaseValidator = (UnionDatatypeValidator*) baseValidator;

    // inherit enumeration
    if (((pBaseValidator->getFacetsDefined() & DatatypeValidator::FACET_ENUMERATION) !=0) &&
        ((getFacetsDefined() & DatatypeValidator::FACET_ENUMERATION) == 0))
    {
        setEnumeration(pBaseValidator->getEnumeration(), true);
    }

}